

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::log_input_event(uint argc)

{
  int iVar1;
  CVmObject *pCVar2;
  char *pcVar3;
  char tag [128];
  CVmObjFileName *fname_param;
  vm_val_t ele2;
  size_t paramlen;
  char *param;
  vm_val_t ele1;
  int len;
  vm_val_t *lst;
  vm_val_t *in_stack_ffffffffffffff18;
  CVmObject *in_stack_ffffffffffffff20;
  vm_val_t *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CVmConsole *in_stack_ffffffffffffff60;
  int local_48;
  char *local_30;
  vm_val_t local_28;
  int local_14;
  vm_val_t *local_10;
  
  CVmBif::check_argc(0,0x2b0b3f);
  local_10 = CVmStack::get(0);
  iVar1 = vm_val_t::is_listlike
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (iVar1 == 0) {
    err_throw(0);
  }
  local_14 = vm_val_t::ll_length(in_stack_ffffffffffffff28);
  if (local_14 < 1) {
    err_throw(0);
  }
  vm_val_t::ll_index((vm_val_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (vm_val_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34);
  if (local_14 < 2) goto LAB_002b0cba;
  vm_val_t::ll_index((vm_val_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (vm_val_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34);
  if (local_48 == 5) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,CVmObjFileName::metaclass_reg_);
    if (iVar1 == 0) goto LAB_002b0c2f;
    in_stack_ffffffffffffff20 = vm_objp(0);
  }
  else {
LAB_002b0c2f:
    in_stack_ffffffffffffff20 = (CVmObject *)0x0;
  }
  if (in_stack_ffffffffffffff20 == (CVmObject *)0x0) {
    local_30 = vm_val_t::get_as_string(in_stack_ffffffffffffff18);
  }
  else {
    local_30 = CVmObjFileName::get_path_string((CVmObjFileName *)in_stack_ffffffffffffff20);
  }
  if (local_30 == (char *)0x0) {
    err_throw(0);
  }
  vmb_get_len((char *)0x2b0c9e);
LAB_002b0cba:
  iVar1 = vm_val_t::is_numeric((vm_val_t *)in_stack_ffffffffffffff20);
  if (iVar1 == 0) {
    pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff18);
    if (pcVar3 == (char *)0x0) {
      err_throw(0);
    }
    CVmStack::push(&local_28);
    CVmBif::pop_str_val_ui
              ((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_t)in_stack_ffffffffffffff28);
    CVmConsole::log_event
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  }
  else {
    vm_val_t::num_to_int((vm_val_t *)in_stack_ffffffffffffff20);
    CVmConsole::log_event
              ((CVmConsole *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c,
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (size_t)in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  }
  CVmStack::discard(1);
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifTIO::log_input_event(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* retrieve the list */
    const vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* make sure we have at least one element */
    int len = lst->ll_length(vmg0_);
    if (len < 1)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the event type code or tag name from the first element */
    vm_val_t ele1;
    lst->ll_index(vmg_ &ele1, 1);

    /* if there's a second element, retrieve the parameter string */
    const char *param = 0;
    size_t paramlen = 0;
    if (len >= 2)
    {
        /* there's a parameter - retrieve it */
        vm_val_t ele2;
        lst->ll_index(vmg_ &ele2, 2);

        /* 
         *   Get its string value.  If it's a filename object, use the
         *   filename path string. 
         */
        CVmObjFileName *fname_param = vm_val_cast(CVmObjFileName, &ele2);
        if (fname_param != 0)
            param = fname_param->get_path_string();
        else
            param = ele2.get_as_string(vmg0_);

        /* if we didn't get a parameter string value, it's an error */
        if (param == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the parameter length and buffer pointer */
        paramlen = vmb_get_len(param);
        param += VMB_LEN;
    }

    /* log the event, according to the type of the event code */
    if (ele1.is_numeric(vmg0_))
    {
        /* it's an integer event type code - log it */
        G_console->log_event(
            vmg_ ele1.num_to_int(vmg0_), param, paramlen, TRUE);
    }
    else if (ele1.get_as_string(vmg0_) != 0)
    {
        /* it's a string event tag - retrieve it in the UI character set */
        char tag[128];
        G_stk->push(&ele1);
        pop_str_val_ui(vmg_ tag, sizeof(tag));

        /* log the event with the given tag */
        G_console->log_event(vmg_ tag, param, paramlen, TRUE);
    }
    else
    {
        /* other types are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* discard arguments */
    G_stk->discard(1);

    /* no return value */
    retval_nil(vmg0_);
}